

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TaggedPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TaggedPatternSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PatternSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,PatternSyntax **args_2)

{
  PatternSyntax *pPVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TaggedPatternSyntax *pTVar12;
  
  pTVar12 = (TaggedPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TaggedPatternSyntax *)this->endPtr < pTVar12 + 1) {
    pTVar12 = (TaggedPatternSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pTVar12 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar3 = args_1->info;
  pPVar1 = *args_2;
  (pTVar12->super_PatternSyntax).super_SyntaxNode.kind = TaggedPattern;
  (pTVar12->super_PatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pTVar12->super_PatternSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pTVar12->tagged).kind = TVar4;
  (pTVar12->tagged).field_0x2 = uVar5;
  (pTVar12->tagged).numFlags = (NumericTokenFlags)NVar6.raw;
  (pTVar12->tagged).rawLen = uVar7;
  (pTVar12->tagged).info = pIVar2;
  (pTVar12->memberName).kind = TVar8;
  (pTVar12->memberName).field_0x2 = uVar9;
  (pTVar12->memberName).numFlags = (NumericTokenFlags)NVar10.raw;
  (pTVar12->memberName).rawLen = uVar11;
  (pTVar12->memberName).info = pIVar3;
  pTVar12->pattern = pPVar1;
  if (pPVar1 != (PatternSyntax *)0x0) {
    (pPVar1->super_SyntaxNode).parent = (SyntaxNode *)pTVar12;
  }
  return pTVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }